

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::
SmallVectorBase<std::variant<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>_>
::emplaceRealloc<slang::ast::LValue::ArraySlice>
          (SmallVectorBase<std::variant<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>_>
           *this,pointer pos,ArraySlice *args)

{
  ConstantRange *pCVar1;
  ulong uVar2;
  size_type sVar3;
  pointer pvVar4;
  _Move_ctor_base<false,_slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
  *p_Var5;
  EVP_PKEY_CTX *__rhs;
  _Move_ctor_base<false,_slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
  *p_Var6;
  EVP_PKEY_CTX *ctx;
  long lVar7;
  ulong capacity;
  size_type sVar8;
  
  if (this->len == 0x7fffffffffffffff) {
    detail::throwLengthError();
  }
  capacity = this->len + 1;
  uVar2 = this->cap;
  if (capacity < uVar2 * 2) {
    capacity = uVar2 * 2;
  }
  if (0x7fffffffffffffff - uVar2 < uVar2) {
    capacity = 0x7fffffffffffffff;
  }
  lVar7 = (long)pos - (long)this->data_;
  p_Var5 = (_Move_ctor_base<false,_slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
            *)detail::allocArray(capacity,0x58);
  pCVar1 = (ConstantRange *)((long)p_Var5 + lVar7);
  *pCVar1 = args->range;
  ctx = (EVP_PKEY_CTX *)&args->defaultValue;
  std::__detail::__variant::
  _Move_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::_Move_ctor_base((_Move_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                     *)(pCVar1 + 1),
                    (_Move_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                     *)ctx);
  *(undefined1 *)&pCVar1[10].left = 2;
  __rhs = (EVP_PKEY_CTX *)this->data_;
  sVar3 = this->len;
  sVar8 = sVar3 * 0x58;
  p_Var6 = p_Var5;
  if (__rhs + sVar8 == (EVP_PKEY_CTX *)pos) {
    while (sVar3 != 0) {
      ctx = __rhs;
      std::__detail::__variant::
      _Move_ctor_base<false,_slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
      ::_Move_ctor_base(p_Var6,(_Move_ctor_base<false,_slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
                                *)__rhs);
      __rhs = __rhs + 0x58;
      sVar8 = sVar8 - 0x58;
      p_Var6 = p_Var6 + 1;
      sVar3 = sVar8;
    }
  }
  else {
    for (; __rhs != (EVP_PKEY_CTX *)pos; __rhs = __rhs + 0x58) {
      ctx = __rhs;
      std::__detail::__variant::
      _Move_ctor_base<false,_slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
      ::_Move_ctor_base(p_Var6,(_Move_ctor_base<false,_slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
                                *)__rhs);
      p_Var6 = p_Var6 + 1;
    }
    sVar3 = this->len;
    pvVar4 = this->data_;
    if ((EVP_PKEY_CTX *)(pvVar4 + sVar3) != (EVP_PKEY_CTX *)pos) {
      p_Var6 = (_Move_ctor_base<false,_slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
                *)(lVar7 + (long)p_Var5);
      do {
        p_Var6 = p_Var6 + 1;
        ctx = (EVP_PKEY_CTX *)pos;
        std::__detail::__variant::
        _Move_ctor_base<false,_slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
        ::_Move_ctor_base(p_Var6,(_Move_ctor_base<false,_slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
                                  *)pos);
        pos = (pointer)((long)pos + 0x58);
      } while ((EVP_PKEY_CTX *)pos != (EVP_PKEY_CTX *)(pvVar4 + sVar3));
    }
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = capacity;
  this->data_ = (pointer)p_Var5;
  return (pointer)((long)p_Var5 + lVar7);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}